

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::
replace_result(storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag> *this
              ,int id,bit_array *x,double value,double duration,size_t hash,long loop,
              int remaining_constraints)

{
  undefined4 uVar1;
  reference pvVar2;
  undefined1 local_58 [8];
  m_indices_reader lock;
  int remaining_constraints_local;
  long loop_local;
  size_t hash_local;
  double duration_local;
  double value_local;
  bit_array *x_local;
  int id_local;
  storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag> *this_local;
  
  lock._12_4_ = remaining_constraints;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_58,&this->m_indices_mutex);
  pvVar2 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)id);
  bit_array::operator=(&pvVar2->x,x);
  pvVar2 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)id);
  pvVar2->value = value;
  pvVar2 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)id);
  pvVar2->duration = duration;
  pvVar2 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)id);
  pvVar2->hash = hash;
  pvVar2 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)id);
  uVar1 = lock._12_4_;
  pvVar2->loop = loop;
  pvVar2 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)id);
  pvVar2->remaining_constraints = uVar1;
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_58);
  return;
}

Assistant:

void replace_result(const int id,
                        const bit_array& x,
                        const double value,
                        const double duration,
                        const std::size_t hash,
                        const long int loop,
                        const int remaining_constraints) noexcept
    {
        m_indices_reader lock{ m_indices_mutex };

        m_data[id].x = x;
        m_data[id].value = value;
        m_data[id].duration = duration;
        m_data[id].hash = hash;
        m_data[id].loop = loop;
        m_data[id].remaining_constraints = remaining_constraints;
    }